

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

void instantiate_children
               (ecs_world_t *world,ecs_entity_t base,ecs_table_t *table,ecs_data_t *data,int32_t row
               ,int32_t count,ecs_table_t *child_table)

{
  short sVar1;
  ecs_vector_t *peVar2;
  ecs_type_t peVar3;
  ecs_column_t *peVar4;
  ulong uVar5;
  ecs_entity_t base_00;
  ulong uVar6;
  int32_t iVar7;
  uint uVar8;
  void *pvVar9;
  ecs_table_t *peVar10;
  ecs_data_t *peVar11;
  short offset;
  long lVar12;
  ecs_entities_t *component_ids;
  void *pvVar13;
  ecs_world_t *world_00;
  int iVar14;
  int32_t *row_out;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uStack_b0;
  undefined1 auStack_a8 [8];
  ecs_entities_t local_a0;
  ecs_table_t *local_90;
  long local_88;
  ecs_world_t *local_80;
  int local_78;
  int32_t local_74;
  int32_t child_row;
  ecs_data_t *local_68;
  void *local_60;
  long local_58;
  ecs_data_t *local_50;
  ulong local_48;
  void *local_40;
  ulong local_38;
  
  local_58 = CONCAT44(local_58._4_4_,count);
  peVar2 = child_table->type;
  uStack_b0 = 0x112908;
  local_90 = table;
  local_50 = data;
  local_48 = base;
  local_68 = ecs_table_get_data(child_table);
  if (local_68 != (ecs_data_t *)0x0) {
    uStack_b0 = 0x11291c;
    iVar7 = ecs_table_data_count(local_68);
    if (iVar7 != 0) {
      lVar16 = (long)child_table->column_count;
      uStack_b0 = 0x112946;
      local_80 = world;
      local_74 = row;
      local_40 = _ecs_vector_first(peVar2,8,0x10);
      uStack_b0 = 0x112952;
      uVar8 = ecs_vector_count(peVar2);
      peVar10 = (ecs_table_t *)
                (auStack_a8 + -((long)(int)(uVar8 * 8 + 1) + 0xfU & 0xfffffffffffffff0));
      lVar12 = (long)peVar10 - (lVar16 * 8 + 0xfU & 0xfffffffffffffff0);
      local_a0.array = (ecs_entity_t *)peVar10;
      local_88 = lVar12;
      local_38 = lVar16;
      if ((int)uVar8 < 1) {
        *(undefined8 *)(lVar12 + -8) = 0x112cdb;
        _ecs_assert(false,0xc,(char *)0x0,"base_index != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x20c);
      }
      else {
        pvVar13 = (void *)(ulong)uVar8;
        uVar18 = 0;
        iVar14 = -1;
        lVar16 = 10;
        iVar15 = 0;
        pvVar9 = local_40;
        _child_row = peVar10;
        local_60 = pvVar13;
        do {
          peVar3 = *(ecs_type_t *)((long)pvVar9 + uVar18 * 8);
          if (peVar3 != (ecs_type_t)0x101) {
            if (((ulong)peVar3 & 0xffffffffffffff) == local_48 &&
                ((ulong)peVar3 & 0xff00000000000000) == 0xfd00000000000000) {
              iVar14 = iVar15;
            }
            if ((long)uVar18 < (long)local_38) {
              peVar4 = local_68->columns;
              offset = *(short *)((long)&peVar4->data + lVar16);
              if (offset < 0x11) {
                offset = 0x10;
              }
              peVar2 = *(ecs_vector_t **)((long)peVar4 + lVar16 + -10);
              sVar1 = *(short *)((long)peVar4 + lVar16 + -2);
              *(undefined8 *)(lVar12 + -8) = 0x112a32;
              pvVar9 = _ecs_vector_first(peVar2,(int)sVar1,offset);
              *(void **)(local_88 + (long)iVar15 * 8) = pvVar9;
              pvVar9 = local_40;
              pvVar13 = local_60;
              peVar10 = _child_row;
            }
            (&peVar10->type)[iVar15] = peVar3;
            iVar15 = iVar15 + 1;
          }
          uVar18 = uVar18 + 1;
          lVar16 = lVar16 + 0x10;
        } while (pvVar13 != (void *)uVar18);
        *(undefined8 *)(lVar12 + -8) = 0x112aa7;
        _ecs_assert(iVar14 != -1,0xc,(char *)0x0,"base_index != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x20c);
        peVar11 = local_68;
        if (iVar14 != -1) {
          if ((local_90->flags & 2) != 0) {
            (&peVar10->type)[iVar15] = (ecs_type_t)0x101;
            iVar15 = iVar15 + 1;
          }
          peVar2 = local_50->entities;
          local_a0.count = iVar15;
          *(undefined8 *)(lVar12 + -8) = 0x112aec;
          local_60 = _ecs_vector_first(peVar2,8,0x10);
          peVar2 = peVar11->entities;
          *(undefined8 *)(lVar12 + -8) = 0x112af8;
          uVar8 = ecs_vector_count(peVar2);
          local_38 = CONCAT44(local_38._4_4_,uVar8);
          if ((int)local_58 < 1) {
            return;
          }
          iVar15 = (int)local_58 + local_74;
          local_58 = (long)iVar14;
          local_40 = (void *)(long)local_74;
          local_50 = (ecs_data_t *)(long)iVar15;
          local_48 = (ulong)uVar8;
          world_00 = local_80;
          do {
            uVar6 = local_48;
            uVar18 = *(ulong *)((long)local_60 + (long)local_40 * 8);
            ((ecs_type_t *)local_a0.array)[local_58] = (ecs_type_t)(uVar18 | 0xfd00000000000000);
            *(undefined8 *)(lVar12 + -8) = 0x112b5e;
            peVar10 = ecs_table_find_or_create(world_00,&local_a0);
            row_out = (int32_t *)0x222;
            *(undefined8 *)(lVar12 + -8) = 0x112b8a;
            _ecs_assert(peVar10 != (ecs_table_t *)0x0,0xc,(char *)0x0,"i_table != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x222);
            _child_row = peVar10;
            if (peVar10 == (ecs_table_t *)0x0) {
              *(undefined8 *)(lVar12 + -8) = 0x112cb9;
              __assert_fail("i_table != ((void*)0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                            ,0x222,
                            "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                           );
            }
            peVar2 = peVar11->entities;
            *(undefined8 *)(lVar12 + -8) = 0x112ba9;
            pvVar9 = _ecs_vector_first(peVar2,8,0x10);
            if (0 < (int)local_38) {
              uVar17 = 0;
              do {
                uVar5 = *(ulong *)((long)pvVar9 + uVar17 * 8);
                row_out = (int32_t *)0x22d;
                *(undefined8 *)(lVar12 + -8) = 0x112be2;
                _ecs_assert(uVar5 != uVar18,2,(char *)0x0,"child != instance",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                            ,0x22d);
                if (uVar5 == uVar18) {
                  *(undefined8 *)(lVar12 + -8) = 0x112c9a;
                  __assert_fail("child != instance",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                                ,0x22d,
                                "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                               );
                }
                uVar17 = uVar17 + 1;
              } while (uVar6 != uVar17);
            }
            peVar10 = _child_row;
            world_00 = local_80;
            lVar16 = local_88;
            iVar14 = (int)local_38;
            component_ids = (ecs_entities_t *)(local_38 & 0xffffffff);
            *(undefined8 *)(lVar12 + -8) = 0x112c15;
            new_w_data(world_00,peVar10,component_ids,(int32_t)lVar16,(void **)&local_78,row_out);
            *(undefined8 *)(lVar12 + -8) = 0x112c1d;
            peVar11 = ecs_table_get_data(peVar10);
            if (0 < iVar14) {
              uVar18 = 0;
              do {
                base_00 = *(ecs_entity_t *)((long)pvVar9 + uVar18 * 8);
                iVar14 = local_78 + (int)uVar18;
                *(undefined8 *)(lVar12 + -8) = 0x112c47;
                instantiate(world_00,base_00,peVar10,peVar11,iVar14,1);
                uVar18 = uVar18 + 1;
              } while (local_48 != uVar18);
            }
            local_40 = (void *)((long)local_40 + 1);
            peVar11 = local_68;
          } while ((long)local_40 < (long)local_50);
          return;
        }
      }
      *(code **)(lVar12 + -8) = set_switch;
      __assert_fail("base_index != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x20c,
                    "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                   );
    }
  }
  return;
}

Assistant:

static
void instantiate_children(
    ecs_world_t * world,
    ecs_entity_t base,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,
    ecs_table_t * child_table)
{
    ecs_type_t type = child_table->type;
    ecs_data_t *child_data = ecs_table_get_data(child_table);
    if (!child_data || !ecs_table_data_count(child_data)) {
        return;
    }

    int32_t column_count = child_table->column_count;
    ecs_entity_t *type_array = ecs_vector_first(type, ecs_entity_t);
    int32_t type_count = ecs_vector_count(type);   

    /* Instantiate child table for each instance */

    /* Create component array for creating the table */
    ecs_entities_t components = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * type_count + 1)
    };

    void **c_info = ecs_os_alloca(ECS_SIZEOF(void*) * column_count);

    /* Copy in component identifiers. Find the base index in the component
     * array, since we'll need this to replace the base with the instance id */
    int i, base_index = -1, pos = 0;

    for (i = 0; i < type_count; i ++) {
        ecs_entity_t c = type_array[i];
        
        /* Make sure instances don't have EcsPrefab */
        if (c == EcsPrefab) {
            continue;
        }

        /* Keep track of the element that creates the CHILDOF relationship with
        * the prefab parent. We need to replace this element to make sure the
        * created children point to the instance and not the prefab */ 
        if (ECS_HAS_ROLE(c, CHILDOF) && (c & ECS_COMPONENT_MASK) == base) {
            base_index = pos;
        }        

        /* Store pointer to component array. We'll use this component array to
        * create our new entities in bulk with new_w_data */
        if (i < column_count) {
            ecs_column_t *column = &child_data->columns[i];
            c_info[pos] = ecs_vector_first_t(
                column->data, column->size, column->alignment);
        }

        components.array[pos] = c;
        pos ++;
    }

    ecs_assert(base_index != -1, ECS_INTERNAL_ERROR, NULL);

    /* If children are added to a prefab, make sure they are prefabs too */
    if (table->flags & EcsTableIsPrefab) {
        components.array[pos] = EcsPrefab;
        pos ++;
    }

    components.count = pos;

    /* Instantiate the prefab child table for each new instance */
    ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);
    int32_t child_count = ecs_vector_count(child_data->entities);

    for (i = row; i < count + row; i ++) {
        ecs_entity_t instance = entities[i];

        /* Replace CHILDOF element in the component array with instance id */
        components.array[base_index] = ECS_CHILDOF | instance;

        /* Find or create table */
        ecs_table_t *i_table = ecs_table_find_or_create(world, &components);
        ecs_assert(i_table != NULL, ECS_INTERNAL_ERROR, NULL); 

        /* The instance is trying to instantiate from a base that is also
         * its parent. This would cause the hierarchy to instantiate itself
         * which would cause infinite recursion. */
        int j;
        ecs_entity_t *children = ecs_vector_first(
            child_data->entities, ecs_entity_t);
#ifndef NDEBUG
        for (j = 0; j < child_count; j ++) {
            ecs_entity_t child = children[j];        
            ecs_assert(child != instance, ECS_INVALID_PARAMETER, NULL);
        }
#endif

        /* Create children */
        int32_t child_row; 
        new_w_data(world, i_table, NULL, child_count, c_info, &child_row);       

        /* If prefab child table has children itself, recursively instantiate */
        ecs_data_t *i_data = ecs_table_get_data(i_table);
        for (j = 0; j < child_count; j ++) {
            ecs_entity_t child = children[j];
            instantiate(world, child, i_table, i_data, child_row + j, 1);
        }
    }       
}